

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_node.c
# Opt level: O0

void NJDNode_load(NJDNode *node,char *str)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *in_RSI;
  NJDNode *in_RDI;
  NJDNode *prev;
  int index_acc;
  int index_pron;
  int index_read;
  int index_orig;
  int index_string;
  int count;
  char buff_acc [1024];
  char buff_pron [1024];
  char buff_read [1024];
  char buff_orig [1024];
  char buff_string [1024];
  char buff [1024];
  int index;
  int j;
  int i;
  NJDNode *node2;
  int acc;
  int in_stack_ffffffffffffe7c0;
  int iVar4;
  int in_stack_ffffffffffffe7c4;
  int local_1838 [4];
  char local_1828 [1024];
  char local_1428 [1024];
  char local_1028 [1024];
  char local_c28 [1024];
  char local_828 [1024];
  char local_428 [1036];
  int local_1c;
  int local_18;
  int local_14;
  char *local_10;
  NJDNode *local_8;
  
  local_1c = 0;
  node2 = (NJDNode *)0x0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  get_token_from_string(in_RSI,&local_1c,local_828,',');
  get_token_from_string(local_10,&local_1c,local_428,',');
  NJDNode_set_pos((NJDNode *)CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0),
                  (char *)node2);
  get_token_from_string(local_10,&local_1c,local_428,',');
  NJDNode_set_pos_group1
            ((NJDNode *)CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0),(char *)node2)
  ;
  get_token_from_string(local_10,&local_1c,local_428,',');
  NJDNode_set_pos_group2
            ((NJDNode *)CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0),(char *)node2)
  ;
  get_token_from_string(local_10,&local_1c,local_428,',');
  NJDNode_set_pos_group3
            ((NJDNode *)CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0),(char *)node2)
  ;
  get_token_from_string(local_10,&local_1c,local_428,',');
  NJDNode_set_ctype((NJDNode *)CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0),
                    (char *)node2);
  get_token_from_string(local_10,&local_1c,local_428,',');
  NJDNode_set_cform((NJDNode *)CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0),
                    (char *)node2);
  get_token_from_string(local_10,&local_1c,local_c28,',');
  get_token_from_string(local_10,&local_1c,local_1028,',');
  get_token_from_string(local_10,&local_1c,local_1428,',');
  get_token_from_string(local_10,&local_1c,local_1828,',');
  get_token_from_string(local_10,&local_1c,local_428,',');
  NJDNode_set_chain_rule
            ((NJDNode *)CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0),(char *)node2)
  ;
  get_token_from_string(local_10,&local_1c,local_428,',');
  iVar1 = strcmp(local_428,"1");
  if (iVar1 == 0) {
    NJDNode_set_chain_flag(local_8,1);
  }
  else {
    iVar1 = strcmp(local_428,"0");
    if (iVar1 == 0) {
      NJDNode_set_chain_flag(local_8,0);
    }
  }
  pcVar2 = strstr(local_1828,"*");
  if ((pcVar2 == (char *)0x0) && (pcVar2 = strstr(local_1828,"/"), pcVar2 != (char *)0x0)) {
    local_1838[3] = 0;
    for (local_14 = 0; local_1828[local_14] != '\0'; local_14 = local_14 + 1) {
      if (local_1828[local_14] == '/') {
        local_1838[3] = local_1838[3] + 1;
      }
    }
    if (local_1838[3] == 1) {
      NJDNode_set_string((NJDNode *)CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0),
                         (char *)node2);
      NJDNode_set_orig((NJDNode *)CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0),
                       (char *)node2);
      NJDNode_set_read((NJDNode *)CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0),
                       (char *)node2);
      NJDNode_set_pron((NJDNode *)CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0),
                       (char *)node2);
      iVar1 = (int)((ulong)node2 >> 0x20);
      iVar4 = 0;
      get_token_from_string(local_1828,(int *)&stack0xffffffffffffe7c0,local_428,'/');
      if (local_428[0] == '\0') {
        local_18 = 0;
        fprintf(_stderr,"WARNING: NJDNode_load() in njd_node.c: Accent is empty.\n");
      }
      else {
        local_18 = atoi(local_428);
      }
      NJDNode_set_acc((NJDNode *)CONCAT44(in_stack_ffffffffffffe7c4,iVar4),iVar1);
      get_token_from_string(local_1828,(int *)&stack0xffffffffffffe7c0,local_428,':');
      if (local_428[0] == '\0') {
        local_18 = 0;
        fprintf(_stderr,"WARNING: NJDNode_load() in njd_node.c: Mora size is empty.\n");
      }
      else {
        local_18 = atoi(local_428);
      }
      NJDNode_set_mora_size((NJDNode *)CONCAT44(in_stack_ffffffffffffe7c4,iVar4),iVar1);
    }
    else {
      local_1838[2] = 0;
      local_1838[1] = 0;
      local_1838[0] = 0;
      iVar4 = 0;
      iVar1 = 0;
      for (local_14 = 0; local_14 < local_1838[3]; local_14 = local_14 + 1) {
        if (0 < local_14) {
          local_8 = (NJDNode *)calloc(1,0x78);
          NJDNode_initialize(local_8);
          NJDNode_copy((NJDNode *)CONCAT44(iVar4,iVar1),node2);
          NJDNode_set_chain_flag(local_8,0);
          local_8->prev = node2;
          node2->next = local_8;
        }
        get_token_from_string(local_c28,local_1838 + 1,local_428,':');
        NJDNode_set_orig((NJDNode *)CONCAT44(iVar4,iVar1),(char *)node2);
        if (local_14 + 1 < local_1838[3]) {
          NJDNode_set_string((NJDNode *)CONCAT44(iVar4,iVar1),(char *)node2);
          sVar3 = strlen(local_428);
          local_1838[2] = local_1838[2] + (int)sVar3;
        }
        else {
          NJDNode_set_string((NJDNode *)CONCAT44(iVar4,iVar1),(char *)node2);
        }
        get_token_from_string(local_1028,local_1838,local_428,':');
        NJDNode_set_read((NJDNode *)CONCAT44(iVar4,iVar1),(char *)node2);
        get_token_from_string(local_1428,(int *)&stack0xffffffffffffe7c4,local_428,':');
        NJDNode_set_pron((NJDNode *)CONCAT44(iVar4,iVar1),(char *)node2);
        acc = (int)((ulong)node2 >> 0x20);
        get_token_from_string(local_1828,(int *)&stack0xffffffffffffe7c0,local_428,'/');
        if (local_428[0] == '\0') {
          local_18 = 0;
          fprintf(_stderr,"WARNING: NJDNode_load() in njd_node.c: Accent is empty.\n");
        }
        else {
          local_18 = atoi(local_428);
        }
        NJDNode_set_acc((NJDNode *)CONCAT44(iVar4,iVar1),acc);
        get_token_from_string(local_1828,(int *)&stack0xffffffffffffe7c0,local_428,':');
        if (local_428[0] == '\0') {
          local_18 = 0;
          fprintf(_stderr,"WARNING: NJDNode_load() in njd_node.c: Mora size is empty.\n");
        }
        else {
          local_18 = atoi(local_428);
        }
        NJDNode_set_mora_size((NJDNode *)CONCAT44(iVar4,iVar1),acc);
        node2 = local_8;
      }
    }
  }
  else {
    NJDNode_set_string((NJDNode *)CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0),
                       (char *)node2);
    NJDNode_set_orig((NJDNode *)CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0),
                     (char *)node2);
    NJDNode_set_read((NJDNode *)CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0),
                     (char *)node2);
    NJDNode_set_pron((NJDNode *)CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0),
                     (char *)node2);
    iVar1 = (int)((ulong)node2 >> 0x20);
    NJDNode_set_acc((NJDNode *)CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0),iVar1);
    NJDNode_set_mora_size
              ((NJDNode *)CONCAT44(in_stack_ffffffffffffe7c4,in_stack_ffffffffffffe7c0),iVar1);
  }
  return;
}

Assistant:

void NJDNode_load(NJDNode * node, const char *str)
{
   int i, j;
   int index = 0;
   char buff[MAXBUFLEN];
   char buff_string[MAXBUFLEN];
   char buff_orig[MAXBUFLEN];
   char buff_read[MAXBUFLEN];
   char buff_pron[MAXBUFLEN];
   char buff_acc[MAXBUFLEN];
   int count;
   int index_string;
   int index_orig;
   int index_read;
   int index_pron;
   int index_acc;
   NJDNode *prev = NULL;

   /* load */
   get_token_from_string(str, &index, buff_string, ',');
   get_token_from_string(str, &index, buff, ',');
   NJDNode_set_pos(node, buff);
   get_token_from_string(str, &index, buff, ',');
   NJDNode_set_pos_group1(node, buff);
   get_token_from_string(str, &index, buff, ',');
   NJDNode_set_pos_group2(node, buff);
   get_token_from_string(str, &index, buff, ',');
   NJDNode_set_pos_group3(node, buff);
   get_token_from_string(str, &index, buff, ',');
   NJDNode_set_ctype(node, buff);
   get_token_from_string(str, &index, buff, ',');
   NJDNode_set_cform(node, buff);
   get_token_from_string(str, &index, buff_orig, ',');
   get_token_from_string(str, &index, buff_read, ',');
   get_token_from_string(str, &index, buff_pron, ',');
   get_token_from_string(str, &index, buff_acc, ',');
   get_token_from_string(str, &index, buff, ',');
   NJDNode_set_chain_rule(node, buff);
   get_token_from_string(str, &index, buff, ',');
   if (strcmp(buff, "1") == 0)
      NJDNode_set_chain_flag(node, 1);
   else if (strcmp(buff, "0") == 0)
      NJDNode_set_chain_flag(node, 0);

   /* for symbol */
   if (strstr(buff_acc, "*") != NULL || strstr(buff_acc, "/") == NULL) {
      NJDNode_set_string(node, buff_string);
      NJDNode_set_orig(node, buff_orig);
      NJDNode_set_read(node, buff_read);
      NJDNode_set_pron(node, buff_pron);
      NJDNode_set_acc(node, 0);
      NJDNode_set_mora_size(node, 0);
      return;
   }

   /* count chained word */
   for (i = 0, count = 0; buff_acc[i] != '\0'; i++)
      if (buff_acc[i] == '/')
         count++;

   /* for single word */
   if (count == 1) {
      NJDNode_set_string(node, buff_string);
      NJDNode_set_orig(node, buff_orig);
      NJDNode_set_read(node, buff_read);
      NJDNode_set_pron(node, buff_pron);
      index_acc = 0;
      get_token_from_string(buff_acc, &index_acc, buff, '/');
      if (buff[0] == '\0') {
         j = 0;
         fprintf(stderr, "WARNING: NJDNode_load() in njd_node.c: Accent is empty.\n");
      } else {
         j = atoi(buff);
      }
      NJDNode_set_acc(node, j);
      get_token_from_string(buff_acc, &index_acc, buff, ':');
      if (buff[0] == '\0') {
         j = 0;
         fprintf(stderr, "WARNING: NJDNode_load() in njd_node.c: Mora size is empty.\n");
      } else {
         j = atoi(buff);
      }
      NJDNode_set_mora_size(node, j);
      return;
   }

   /* parse chained word */
   index_string = 0;
   index_orig = 0;
   index_read = 0;
   index_pron = 0;
   index_acc = 0;
   for (i = 0; i < count; i++) {
      if (i > 0) {
         node = (NJDNode *) calloc(1, sizeof(NJDNode));
         NJDNode_initialize(node);
         NJDNode_copy(node, prev);
         NJDNode_set_chain_flag(node, 0);
         node->prev = prev;
         prev->next = node;
      }
      /* orig */
      get_token_from_string(buff_orig, &index_orig, buff, ':');
      NJDNode_set_orig(node, buff);
      /* string */
      if (i + 1 < count) {
         NJDNode_set_string(node, buff);
         index_string += strlen(buff);
      } else {
         NJDNode_set_string(node, &buff_string[index_string]);
      }
      /* read */
      get_token_from_string(buff_read, &index_read, buff, ':');
      NJDNode_set_read(node, buff);
      /* pron */
      get_token_from_string(buff_pron, &index_pron, buff, ':');
      NJDNode_set_pron(node, buff);
      /* acc */
      get_token_from_string(buff_acc, &index_acc, buff, '/');
      if (buff[0] == '\0') {
         j = 0;
         fprintf(stderr, "WARNING: NJDNode_load() in njd_node.c: Accent is empty.\n");
      } else {
         j = atoi(buff);
      }
      NJDNode_set_acc(node, j);
      /* mora size */
      get_token_from_string(buff_acc, &index_acc, buff, ':');
      if (buff[0] == '\0') {
         j = 0;
         fprintf(stderr, "WARNING: NJDNode_load() in njd_node.c: Mora size is empty.\n");
      } else {
         j = atoi(buff);
      }
      NJDNode_set_mora_size(node, j);
      prev = node;
   }
}